

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

int ParseExpCmp(char **p,aint *nval)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  aint right;
  int local_3c;
  aint *local_38;
  
  iVar2 = ParseExpMinMax(p,&local_3c);
  if (iVar2 != 0) {
    iVar2 = local_3c;
    local_38 = nval;
    while( true ) {
      iVar3 = need(p,"<=>=< > ");
      if (iVar3 == 0) {
        *local_38 = iVar2;
        return 1;
      }
      iVar4 = ParseExpMinMax(p,&right);
      if (iVar4 == 0) break;
      if (iVar3 == 0x7b) {
        bVar1 = right <= iVar2;
LAB_0011f325:
        iVar2 = -(uint)bVar1;
      }
      else {
        if (iVar3 == 0x3e) {
          bVar1 = right < iVar2;
          goto LAB_0011f325;
        }
        if (iVar3 == 0x79) {
          bVar1 = iVar2 <= right;
          goto LAB_0011f325;
        }
        if (iVar3 == 0x3c) {
          bVar1 = iVar2 < right;
          goto LAB_0011f325;
        }
        Error("internal error",(char *)0x0,FATAL);
      }
    }
  }
  return 0;
}

Assistant:

static int ParseExpCmp(char*& p, aint& nval) {
	aint left, right;
	int oper;
	if (!ParseExpMinMax(p, left)) return 0;
	while ((oper = need(p, "<=>=< > "))) {
		if (!ParseExpMinMax(p, right)) return 0;
		switch (oper) {
		case '<':
			left = -(left < right); break;
		case '>':
			left = -(left > right); break;
		case '<'+'=':
			left = -(left <= right); break;
		case '>'+'=':
			left = -(left >= right); break;
		default: Error("internal error", nullptr, FATAL); break;	// unreachable
		}
	}
	nval = left;
	return 1;
}